

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# express_node.cpp
# Opt level: O1

void __thiscall front::express::ExpressNode::ExpressNode(ExpressNode *this)

{
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  (this->_children).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_children).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_children).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_type = CNS;
  this->_operation = AND;
  this->_value = 0;
  std::__cxx11::string::_M_replace((ulong)&this->_name,0,(char *)0x0,0x1b8ba5);
  return;
}

Assistant:

ExpressNode::ExpressNode() {
  _type = NodeType::CNS;
  _operation = OperationType::AND;
  _value = 0;
  _name = "";
}